

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O1

void av1_calc_proj_params_high_bd_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  int64_t aiVar2 [2];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t aiVar9 [2];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar12 [64];
  undefined1 auVar18 [64];
  
  if (params->r[0] < 1) {
LAB_00492160:
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    }
    else {
      lVar6 = (long)src8 * 2;
      lVar7 = (long)dat8 * 2;
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      uVar5 = 0;
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      do {
        if (0 < width) {
          lVar8 = 0;
          do {
            auVar11 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar8 * 2));
            auVar14 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar8 * 2));
            auVar21 = vpslld_avx2(auVar11,4);
            auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar8),auVar21);
            auVar11 = vpsubd_avx2(auVar14,auVar11);
            auVar13 = vpslld_avx2(auVar11,4);
            auVar11 = vpmuldq_avx2(auVar17,auVar17);
            auVar11 = vpaddq_avx2(auVar12._0_32_,auVar11);
            auVar21 = vpshufd_avx2(auVar17,0xf5);
            auVar14 = vpmuldq_avx2(auVar21,auVar21);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar12 = ZEXT3264(auVar11);
            auVar11 = vpmuldq_avx2(auVar13,auVar17);
            auVar11 = vpaddq_avx2(auVar15._0_32_,auVar11);
            auVar14 = vpsrlq_avx2(auVar13,0x20);
            auVar14 = vpmuldq_avx2(auVar14,auVar21);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar15 = ZEXT3264(auVar11);
            lVar8 = lVar8 + 8;
          } while (lVar8 < width);
        }
        auVar14 = auVar15._0_32_;
        auVar11 = auVar12._0_32_;
        uVar5 = uVar5 + 1;
        flt1 = flt1 + flt1_stride;
        lVar6 = lVar6 + (long)src_stride * 2;
        lVar7 = lVar7 + (long)dat_stride * 2;
      } while (uVar5 != (uint)height);
    }
    auVar1 = vpaddq_avx(auVar11._16_16_,auVar11._0_16_);
    auVar10 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar10);
    auVar10 = vpaddq_avx(auVar14._16_16_,auVar14._0_16_);
    auVar3 = vpshufd_avx(auVar10,0xee);
    auVar10 = vpaddq_avx(auVar10,auVar3);
    auVar10 = vpslldq_avx(auVar10,8);
    aiVar9 = (int64_t  [2])vpslldq_avx(auVar1,8);
    *(undefined1 (*) [16])C = auVar10;
    H[1] = aiVar9;
    lVar7 = (long)(height * width);
    H[1][1] = H[1][1] / lVar7;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < params->r[0]) {
        if (height < 1) {
          auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        }
        else {
          lVar6 = (long)src8 * 2;
          lVar7 = (long)dat8 * 2;
          auVar12 = ZEXT1664((undefined1  [16])0x0);
          uVar5 = 0;
          auVar15 = ZEXT1664((undefined1  [16])0x0);
          do {
            if (0 < width) {
              lVar8 = 0;
              do {
                auVar11 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar8 * 2));
                auVar14 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar8 * 2));
                auVar21 = vpslld_avx2(auVar11,4);
                auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar8),auVar21);
                auVar11 = vpsubd_avx2(auVar14,auVar11);
                auVar13 = vpslld_avx2(auVar11,4);
                auVar11 = vpmuldq_avx2(auVar17,auVar17);
                auVar11 = vpaddq_avx2(auVar12._0_32_,auVar11);
                auVar21 = vpshufd_avx2(auVar17,0xf5);
                auVar14 = vpmuldq_avx2(auVar21,auVar21);
                auVar11 = vpaddq_avx2(auVar14,auVar11);
                auVar12 = ZEXT3264(auVar11);
                auVar11 = vpmuldq_avx2(auVar13,auVar17);
                auVar11 = vpaddq_avx2(auVar15._0_32_,auVar11);
                auVar14 = vpsrlq_avx2(auVar13,0x20);
                auVar14 = vpmuldq_avx2(auVar14,auVar21);
                auVar11 = vpaddq_avx2(auVar14,auVar11);
                auVar15 = ZEXT3264(auVar11);
                lVar8 = lVar8 + 8;
              } while (lVar8 < width);
            }
            auVar14 = auVar15._0_32_;
            auVar11 = auVar12._0_32_;
            uVar5 = uVar5 + 1;
            flt0 = flt0 + flt0_stride;
            lVar6 = lVar6 + (long)src_stride * 2;
            lVar7 = lVar7 + (long)dat_stride * 2;
          } while (uVar5 != (uint)height);
        }
        auVar1 = vpaddq_avx(auVar11._16_16_,auVar11._0_16_);
        auVar10 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar10);
        auVar10 = vpaddq_avx(auVar14._16_16_,auVar14._0_16_);
        auVar3 = vpshufd_avx(auVar10,0xee);
        auVar10 = vpaddq_avx(auVar10,auVar3);
        *C = auVar10._0_8_;
        C[1] = 0;
        (*H)[0] = auVar1._0_8_;
        (*H)[1] = 0;
        lVar7 = (long)(height * width);
        (*H)[0] = (*H)[0] / lVar7;
        goto LAB_0049226c;
      }
      goto LAB_00492160;
    }
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = auVar18._0_32_;
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = auVar19._0_32_;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = auVar15._0_32_;
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = auVar16._0_32_;
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar11 = auVar12._0_32_;
    if (0 < height) {
      lVar6 = (long)src8 * 2;
      lVar7 = (long)dat8 * 2;
      uVar5 = 0;
      do {
        if (0 < width) {
          lVar8 = 0;
          do {
            auVar11 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar7 + lVar8 * 2));
            auVar14 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar8 * 2));
            auVar21 = vpslld_avx2(auVar11,4);
            auVar11 = vpsubd_avx2(auVar14,auVar11);
            auVar20 = vpslld_avx2(auVar11,4);
            auVar13 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar8),auVar21);
            auVar4 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar8),auVar21);
            auVar11 = vpmuldq_avx2(auVar13,auVar13);
            auVar11 = vpaddq_avx2(auVar11,auVar12._0_32_);
            auVar21 = vpshufd_avx2(auVar13,0xf5);
            auVar14 = vpmuldq_avx2(auVar21,auVar21);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar12 = ZEXT3264(auVar11);
            auVar11 = vpmuldq_avx2(auVar4,auVar13);
            auVar11 = vpaddq_avx2(auVar11,auVar16._0_32_);
            auVar17 = vpshufd_avx2(auVar4,0xf5);
            auVar14 = vpmuldq_avx2(auVar17,auVar21);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar16 = ZEXT3264(auVar11);
            auVar11 = vpmuldq_avx2(auVar4,auVar4);
            auVar11 = vpaddq_avx2(auVar11,auVar15._0_32_);
            auVar14 = vpmuldq_avx2(auVar17,auVar17);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar15 = ZEXT3264(auVar11);
            auVar11 = vpmuldq_avx2(auVar20,auVar13);
            auVar11 = vpaddq_avx2(auVar19._0_32_,auVar11);
            auVar13 = vpshufd_avx2(auVar20,0xf5);
            auVar14 = vpmuldq_avx2(auVar13,auVar21);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar19 = ZEXT3264(auVar11);
            auVar11 = vpmuldq_avx2(auVar4,auVar20);
            auVar11 = vpaddq_avx2(auVar18._0_32_,auVar11);
            auVar14 = vpmuldq_avx2(auVar17,auVar13);
            auVar11 = vpaddq_avx2(auVar14,auVar11);
            auVar18 = ZEXT3264(auVar11);
            lVar8 = lVar8 + 8;
          } while (lVar8 < width);
        }
        auVar14 = auVar15._0_32_;
        auVar21 = auVar16._0_32_;
        auVar13 = auVar19._0_32_;
        auVar11 = auVar12._0_32_;
        auVar17 = auVar18._0_32_;
        uVar5 = uVar5 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar6 = lVar6 + (long)src_stride * 2;
        lVar7 = lVar7 + (long)dat_stride * 2;
      } while (uVar5 != (uint)height);
    }
    auVar4 = vpunpcklqdq_avx2(auVar13,auVar17);
    auVar17 = vpunpckhqdq_avx2(auVar13,auVar17);
    auVar17 = vpaddq_avx2(auVar4,auVar17);
    auVar1 = vpaddq_avx(auVar17._16_16_,auVar17._0_16_);
    auVar17 = vpunpcklqdq_avx2(auVar11,auVar21);
    auVar11 = vpunpckhqdq_avx2(auVar11,auVar21);
    auVar11 = vpaddq_avx2(auVar17,auVar11);
    aiVar9 = (int64_t  [2])vpaddq_avx(auVar11._16_16_,auVar11._0_16_);
    auVar21 = vpslldq_avx2(auVar14,8);
    auVar11 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar14,0xcc);
    auVar11 = vpaddq_avx2(auVar21,auVar11);
    aiVar2 = (int64_t  [2])vpaddq_avx(auVar11._16_16_,auVar11._0_16_);
    *(undefined1 (*) [16])C = auVar1;
    *H = aiVar9;
    H[1] = aiVar2;
    lVar7 = (long)(height * width);
    lVar6 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar7;
    lVar6 = lVar6 / lVar7;
    (*H)[1] = lVar6;
    H[1][1] = H[1][1] / lVar7;
    H[1][0] = lVar6;
    *C = *C / lVar7;
  }
  C = C + 1;
LAB_0049226c:
  *C = *C / lVar7;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_avx2(const uint8_t *src8, int width,
                                       int height, int src_stride,
                                       const uint8_t *dat8, int dat_stride,
                                       int32_t *flt0, int flt0_stride,
                                       int32_t *flt1, int flt1_stride,
                                       int64_t H[2][2], int64_t C[2],
                                       const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                        dat_stride, flt0, flt0_stride, flt1,
                                        flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt1, flt1_stride, H, C);
  }
}